

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_m33d(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t isz;
  exr_attr_m33d_t tmp;
  undefined4 local_5c;
  undefined1 local_58 [72];
  
  memcpy(local_58,a,0x48);
  local_5c = 0x48;
  eVar1 = (*ctxt->do_write)(ctxt,&local_5c,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,local_58,0x48,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_m33d (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m33d_t tmp = *(a->m33d);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m33d_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_64 (ctxt, &tmp, 9);
    return rv;
}